

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O0

void (anonymous_namespace)::TextRegBits<(anonymous_namespace)::EnumArg<TimerClock>>
               (Emulator *e,u8 v,BitArg arg,EnumArg<TimerClock> args)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  char *local_48;
  char *text;
  bool is_set;
  u8 masked;
  u8 v_local;
  Emulator *e_local;
  EnumArg<TimerClock> args_local;
  
  bVar1 = v & arg.mask;
  if (((undefined1  [40])arg & (undefined1  [40])0x1) != (undefined1  [40])0x0) {
    bVar1 = (bVar1 != 0 ^ 0xffU) & 1;
  }
  if (bVar1 == 0) {
    local_48 = arg.false_text;
  }
  else {
    local_48 = arg.true_text;
  }
  sVar3 = strlen(local_48);
  if (sVar3 != 0) {
    ImGui::SameLine(0.0,-1.0);
    ImGui::Text("%s",local_48);
    if ((arg.tooltip != (char *)0x0) && (bVar2 = ImGui::IsItemHovered(0), bVar2)) {
      ImGui::SetTooltip(arg.tooltip);
    }
  }
  anon_unknown.dwarf_71760::TextRegBits<TimerClock>(e,v,args);
  return;
}

Assistant:

void TextRegBits(Emulator* e, u8 v, BitArg arg, Args... args) {
  u8 masked = v & arg.mask;
  bool is_set = arg.invert ? !masked : masked;
  const char* text = is_set ? arg.true_text : arg.false_text;
  if (strlen(text) != 0) {
    ImGui::SameLine();
    ImGui::Text("%s", text);
    if (arg.tooltip && ImGui::IsItemHovered()) {
      ImGui::SetTooltip(arg.tooltip);
    }
  }
  TextRegBits(e, v, args...);
}